

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

duckdb_state
duckdb_arrow_array_scan
          (duckdb_connection connection,char *table_name,duckdb_arrow_schema arrow_schema,
          duckdb_arrow_array arrow_array,duckdb_arrow_stream *out_stream)

{
  duckdb_state dVar1;
  undefined8 *puVar2;
  duckdb_arrow_stream arrow;
  
  puVar2 = (undefined8 *)operator_new(0x18);
  *(undefined1 *)(puVar2 + 2) = 0;
  *puVar2 = arrow_schema;
  puVar2[1] = arrow_array;
  arrow = (duckdb_arrow_stream)operator_new(0x28);
  *out_stream = arrow;
  *(code **)arrow = arrow_array_stream_wrapper::anon_unknown_0::GetSchema;
  *(code **)(arrow + 8) = arrow_array_stream_wrapper::anon_unknown_0::GetNext;
  *(code **)(arrow + 0x10) = arrow_array_stream_wrapper::anon_unknown_0::GetLastError;
  *(code **)(arrow + 0x18) = arrow_array_stream_wrapper::anon_unknown_0::Release;
  *(undefined8 **)(arrow + 0x20) = puVar2;
  dVar1 = duckdb_arrow_scan(connection,table_name,arrow);
  return dVar1;
}

Assistant:

duckdb_state duckdb_arrow_array_scan(duckdb_connection connection, const char *table_name,
                                     duckdb_arrow_schema arrow_schema, duckdb_arrow_array arrow_array,
                                     duckdb_arrow_stream *out_stream) {
	auto private_data = new arrow_array_stream_wrapper::PrivateData;
	private_data->schema = reinterpret_cast<ArrowSchema *>(arrow_schema);
	private_data->array = reinterpret_cast<ArrowArray *>(arrow_array);
	private_data->done = false;

	ArrowArrayStream *stream = new ArrowArrayStream;
	*out_stream = reinterpret_cast<duckdb_arrow_stream>(stream);
	stream->get_schema = arrow_array_stream_wrapper::GetSchema;
	stream->get_next = arrow_array_stream_wrapper::GetNext;
	stream->get_last_error = arrow_array_stream_wrapper::GetLastError;
	stream->release = arrow_array_stream_wrapper::Release;
	stream->private_data = private_data;

	return duckdb_arrow_scan(connection, table_name, reinterpret_cast<duckdb_arrow_stream>(stream));
}